

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O0

void __thiscall glu::ContextInfo::ContextInfo(ContextInfo *this,RenderContext *context)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  char *pcVar4;
  reference this_00;
  int local_b4;
  int local_b0;
  int ndx;
  int numExtensions;
  char *local_88;
  char *result;
  ContextType local_78;
  ApiType local_74;
  long local_70;
  Functions *gl;
  set<int,_std::less<int>,_std::allocator<int>_> local_58;
  RenderContext *local_18;
  RenderContext *context_local;
  ContextInfo *this_local;
  
  this->_vptr_ContextInfo = (_func_int **)&PTR__ContextInfo_032e9078;
  this->m_context = context;
  local_18 = context;
  context_local = (RenderContext *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_extensions);
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_58._M_t._M_impl._0_8_ = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&local_58);
  CachedValue<std::set<int,_std::less<int>,_std::allocator<int>_>,_glu::GetCompressedTextureFormats>
  ::CachedValue(&this->m_compressedTextureFormats);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_58);
  iVar2 = (*local_18->_vptr_RenderContext[3])();
  local_70 = CONCAT44(extraout_var,iVar2);
  local_78.super_ApiType.m_bits = (ApiType)(*local_18->_vptr_RenderContext[2])();
  local_74 = ContextType::getAPI(&local_78);
  result._4_4_ = ApiType::es(2,0);
  bVar1 = ApiType::operator==(&local_74,result._4_4_);
  if (bVar1) {
    local_88 = (char *)(**(code **)(local_70 + 0xa78))(0x1f03);
    dVar3 = (**(code **)(local_70 + 0x800))();
    checkError(dVar3,"glGetString(GL_EXTENSIONS) failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluContextInfo.cpp"
               ,0xc1);
    pcVar4 = local_88;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&numExtensions,pcVar4,(allocator<char> *)((long)&ndx + 3));
    split(&this->m_extensions,(string *)&numExtensions);
    std::__cxx11::string::~string((string *)&numExtensions);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ndx + 3));
  }
  else {
    local_b0 = 0;
    (**(code **)(local_70 + 0x868))(0x821d,&local_b0);
    dVar3 = (**(code **)(local_70 + 0x800))();
    checkError(dVar3,"glGetIntegerv(GL_NUM_EXTENSIONS) failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluContextInfo.cpp"
               ,0xca);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->m_extensions,(long)local_b0);
    for (local_b4 = 0; local_b4 < local_b0; local_b4 = local_b4 + 1) {
      pcVar4 = (char *)(**(code **)(local_70 + 0xa80))(0x1f03,local_b4);
      this_00 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&this->m_extensions,(long)local_b4);
      std::__cxx11::string::operator=((string *)this_00,pcVar4);
    }
    dVar3 = (**(code **)(local_70 + 0x800))();
    checkError(dVar3,"glGetStringi(GL_EXTENSIONS, ndx) failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluContextInfo.cpp"
               ,0xcf);
  }
  return;
}

Assistant:

ContextInfo::ContextInfo (const RenderContext& context)
	: m_context(context)
{
	const glw::Functions& gl = context.getFunctions();

	if (context.getType().getAPI() == ApiType::es(2,0))
	{
		const char* result = (const char*)gl.getString(GL_EXTENSIONS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetString(GL_EXTENSIONS) failed");

		split(m_extensions, string(result));
	}
	else
	{
		int				numExtensions	= 0;

		gl.getIntegerv(GL_NUM_EXTENSIONS, &numExtensions);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv(GL_NUM_EXTENSIONS) failed");

		m_extensions.resize(numExtensions);
		for (int ndx = 0; ndx < numExtensions; ndx++)
			m_extensions[ndx] = (const char*)gl.getStringi(GL_EXTENSIONS, ndx);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetStringi(GL_EXTENSIONS, ndx) failed");
	}
}